

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MonteCarloPricer.h
# Opt level: O0

PriceCI * __thiscall
MonteCarloPricer::priceClassic<DigitalPut>
          (PriceCI *__return_storage_ptr__,MonteCarloPricer *this,BlackScholesModel *model,
          DigitalPut *option)

{
  DigitalPut *this_00;
  double dVar1;
  double dVar2;
  double local_60;
  double payoff_std;
  double payoff_mean;
  double local_48;
  int local_3c;
  double dStack_38;
  int i;
  double payoff_sq_mean;
  double payoff_sum;
  double payoff;
  DigitalPut *option_local;
  BlackScholesModel *model_local;
  MonteCarloPricer *this_local;
  
  payoff_sq_mean = 0.0;
  dStack_38 = 0.0;
  payoff = (double)option;
  option_local = (DigitalPut *)model;
  model_local = (BlackScholesModel *)this;
  for (local_3c = 0; this_00 = option_local, dVar1 = payoff, local_3c < this->num_sims;
      local_3c = local_3c + 1) {
    payoff_mean = Option::getMaturity((Option *)payoff);
    local_48 = BlackScholesModel::generatePrice((BlackScholesModel *)this_00,&payoff_mean);
    payoff_sum = (double)(**(code **)(*(long *)dVar1 + 8))(dVar1,&local_48);
    payoff_sq_mean = payoff_sum + payoff_sq_mean;
    dStack_38 = payoff_sum * payoff_sum + dStack_38;
  }
  payoff_std = payoff_sq_mean / (double)this->num_sims;
  local_60 = -payoff_std * payoff_std + dStack_38 / (double)this->num_sims;
  dVar1 = BlackScholesModel::getRiskFreeRate((BlackScholesModel *)option_local);
  dVar2 = Option::getMaturity((Option *)payoff);
  dVar1 = exp(-dVar1 * dVar2);
  payoff_std = dVar1 * payoff_std;
  dVar1 = BlackScholesModel::getRiskFreeRate((BlackScholesModel *)option_local);
  dVar2 = Option::getMaturity((Option *)payoff);
  dVar1 = exp(dVar1 * -2.0 * dVar2);
  local_60 = dVar1 * local_60;
  PriceCI::PriceCI(__return_storage_ptr__,&payoff_std,&local_60,&this->num_sims);
  return __return_storage_ptr__;
}

Assistant:

inline PriceCI MonteCarloPricer::priceClassic(BlackScholesModel const& model, pathIndependentOption const& option) const
{
	double payoff, payoff_sum = 0.0, payoff_sq_mean = 0.0;
	for (int i = 0; i < num_sims; i++) {
		payoff = option.payoff(model.generatePrice(option.getMaturity()));
		payoff_sum += payoff;
		payoff_sq_mean += payoff * payoff;
	}
	double payoff_mean = payoff_sum / static_cast<double>(num_sims);
	double payoff_std = (payoff_sq_mean / static_cast<double>(num_sims)) - payoff_mean * payoff_mean;
	payoff_mean *= exp(-model.getRiskFreeRate() * option.getMaturity());
	payoff_std *= exp(-2 * model.getRiskFreeRate() * option.getMaturity());
	return { payoff_mean, payoff_std, num_sims };
}